

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluCallLogWrapper.cpp
# Opt level: O0

ostream * __thiscall glu::operator<<(glu *this,ostream *str,FboParamPtrFmt fmt)

{
  Hex<8UL> hex;
  ostream *poVar1;
  Enum<int,_2UL> local_78;
  Enum<int,_2UL> local_68;
  Enum<int,_2UL> local_58;
  Enum<int,_2UL> local_48;
  Enum<int,_2UL> local_38;
  glu *local_28;
  ostream *str_local;
  FboParamPtrFmt fmt_local;
  
  fmt_local._0_8_ = fmt._0_8_;
  str_local._0_4_ = (int)str;
  local_28 = this;
  if ((int *)fmt_local._0_8_ == (int *)0x0) {
    fmt_local.value = (int *)std::operator<<((ostream *)this,"(null)");
  }
  else if ((int)str_local == 0x8210) {
    tcu::Format::Enum<int,_2UL>::Enum
              (&local_68,getFramebufferColorEncodingName,*(int *)fmt_local._0_8_);
    fmt_local.value = (int *)tcu::Format::operator<<((ostream *)this,&local_68);
  }
  else if ((int)str_local == 0x8211) {
    tcu::Format::Enum<int,_2UL>::Enum(&local_58,getTypeName,*(int *)fmt_local._0_8_);
    fmt_local.value = (int *)tcu::Format::operator<<((ostream *)this,&local_58);
  }
  else {
    if (5 < (int)str_local - 0x8212U) {
      if ((int)str_local == 0x8cd0) {
        tcu::Format::Enum<int,_2UL>::Enum
                  (&local_38,getFramebufferAttachmentTypeName,*(int *)fmt_local._0_8_);
        poVar1 = tcu::Format::operator<<((ostream *)this,&local_38);
        return poVar1;
      }
      if (1 < (int)str_local - 0x8cd1U) {
        if ((int)str_local == 0x8cd3) {
          tcu::Format::Enum<int,_2UL>::Enum(&local_48,getCubeMapFaceName,*(int *)fmt_local._0_8_);
          poVar1 = tcu::Format::operator<<((ostream *)this,&local_48);
          return poVar1;
        }
        if ((int)str_local != 0x8cd4) {
          if ((int)str_local != 0x8da7) {
            hex = tcu::toHex<int>(*(int *)fmt_local._0_8_);
            poVar1 = tcu::Format::operator<<((ostream *)this,hex);
            return poVar1;
          }
          tcu::Format::Enum<int,_2UL>::Enum(&local_78,getBooleanName,*(int *)fmt_local._0_8_);
          poVar1 = tcu::Format::operator<<((ostream *)this,&local_78);
          return poVar1;
        }
      }
    }
    fmt_local.value = (int *)std::ostream::operator<<(this,*(int *)fmt_local._0_8_);
  }
  return (ostream *)fmt_local.value;
}

Assistant:

std::ostream& operator<< (std::ostream& str, FboParamPtrFmt fmt)
{
	if (fmt.value)
	{
		switch (fmt.param)
		{
			case GL_FRAMEBUFFER_ATTACHMENT_OBJECT_TYPE:
				return str << tcu::Format::Enum<int, 2>(getFramebufferAttachmentTypeName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_CUBE_MAP_FACE:
				return str << tcu::Format::Enum<int, 2>(getCubeMapFaceName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_COMPONENT_TYPE:
				return str << tcu::Format::Enum<int, 2>(getTypeName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_COLOR_ENCODING:
				return str << tcu::Format::Enum<int, 2>(getFramebufferColorEncodingName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_LAYERED:
				return str << tcu::Format::Enum<int, 2>(getBooleanName, *fmt.value);

			case GL_FRAMEBUFFER_ATTACHMENT_OBJECT_NAME:
			case GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LAYER:
			case GL_FRAMEBUFFER_ATTACHMENT_TEXTURE_LEVEL:
			case GL_FRAMEBUFFER_ATTACHMENT_RED_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_GREEN_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_BLUE_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_ALPHA_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_DEPTH_SIZE:
			case GL_FRAMEBUFFER_ATTACHMENT_STENCIL_SIZE:
				return str << *fmt.value;

			default:
				return str << tcu::toHex(*fmt.value);
		}
	}
	else
		return str << "(null)";
}